

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O1

vbool<4> __thiscall
embree::sse42::InstanceArrayIntersectorK<4>::occluded
          (InstanceArrayIntersectorK<4> *this,vbool<4> *valid_i,Precalculations *pre,RayK<4> *ray,
          RayQueryContext *context,Primitive_conflict4 *prim)

{
  RayK<4> *pRVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  RTCRayQueryContext *pRVar6;
  long *plVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [12];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  ulong uVar23;
  long lVar24;
  Geometry *extraout_RDX;
  Geometry *pGVar25;
  int iVar26;
  float fVar27;
  float fVar31;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar32;
  float fVar35;
  float fVar36;
  undefined1 in_XMM2 [16];
  vfloat4 l02;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar37;
  float fVar38;
  float fVar41;
  float fVar43;
  vfloat4 v_1;
  undefined1 auVar39 [16];
  float fVar42;
  float fVar44;
  undefined1 auVar40 [16];
  float fVar45;
  float fVar50;
  float fVar51;
  undefined1 in_XMM4 [16];
  vfloat4 v;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  undefined1 auVar56 [12];
  undefined1 in_XMM6 [16];
  undefined1 auVar57 [16];
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 in_XMM8 [16];
  vfloat4 a0;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar64 [16];
  undefined1 auVar69 [16];
  float fVar70;
  undefined1 in_XMM11 [16];
  undefined1 auVar71 [16];
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  vbool<4> vVar76;
  RayQueryContext newcontext;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_48 [16];
  _func_int *local_30;
  RTCRayQueryContext *local_28;
  RTCIntersectArguments *local_20;
  undefined1 auVar46 [16];
  
  uVar2 = mm_lookupmask_ps._8_8_;
  auVar56 = in_XMM6._0_12_;
  uVar3 = prim->primID_;
  uVar4 = prim->instID_;
  pGVar25 = (context->scene->geometries).items[uVar4].ptr;
  local_30 = *(_func_int **)&pGVar25->field_0x58;
  if (local_30 == (_func_int *)0x0) {
    uVar23 = (ulong)*(uint *)(*(long *)&pGVar25[1].time_range.upper +
                             (long)pGVar25[1].intersectionFilterN * (ulong)uVar3);
    if (uVar23 == 0xffffffff) {
      local_30 = (_func_int *)0x0;
    }
    else {
      local_30 = pGVar25[1].super_RefCount._vptr_RefCount[uVar23];
    }
  }
  if (local_30 != (_func_int *)0x0) {
    uVar5 = pGVar25->mask;
    auVar29._0_4_ = -(uint)((uVar5 & *(uint *)(ray + 0x90)) == 0);
    auVar29._4_4_ = -(uint)((uVar5 & *(uint *)(ray + 0x94)) == 0);
    auVar29._8_4_ = -(uint)((uVar5 & *(uint *)(ray + 0x98)) == 0);
    auVar29._12_4_ = -(uint)((uVar5 & *(uint *)(ray + 0x9c)) == 0);
    local_48 = ~auVar29 & (undefined1  [16])valid_i->field_0;
    iVar26 = movmskps((int)valid_i,local_48);
    if (iVar26 != 0) {
      pRVar6 = context->user;
      auVar54._8_8_ = mm_lookupmask_ps._8_8_;
      auVar54._0_8_ = mm_lookupmask_ps._0_8_;
      *(undefined1 (*) [16])this = auVar54;
      if (pRVar6->instID[0] == 0xffffffff) {
        pRVar6->instID[0] = uVar4;
        pRVar6->instPrimID[0] = uVar3;
        uVar23 = (ulong)prim->primID_;
        plVar7 = *(long **)&pGVar25[1].fnumTimeSegments;
        iVar26 = (int)plVar7[4];
        if ((pGVar25->field_8).field_0x1 == '\x01') {
          if (iVar26 == 0x9134) {
            lVar8 = *plVar7;
            lVar24 = uVar23 * plVar7[2];
            auVar29 = insertps(ZEXT416(*(uint *)(lVar8 + lVar24)),
                               *(undefined4 *)(lVar8 + 0x10 + lVar24),0x1c);
            auVar54 = insertps(auVar29,*(undefined4 *)(lVar8 + 0x20 + lVar24),0x28);
            auVar29 = insertps(ZEXT416(*(uint *)(lVar8 + 4 + lVar24)),
                               *(undefined4 *)(lVar8 + 0x14 + lVar24),0x1c);
            in_XMM2 = insertps(auVar29,*(undefined4 *)(lVar8 + 0x24 + lVar24),0x28);
            auVar29 = insertps(ZEXT416(*(uint *)(lVar8 + 8 + lVar24)),
                               *(undefined4 *)(lVar8 + 0x18 + lVar24),0x1c);
            in_XMM11 = insertps(auVar29,*(undefined4 *)(lVar8 + 0x28 + lVar24),0x28);
            auVar29 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar24)),
                               *(undefined4 *)(lVar8 + 0x1c + lVar24),0x1c);
            in_XMM4 = insertps(auVar29,*(undefined4 *)(lVar8 + 0x2c + lVar24),0x28);
          }
          else if (iVar26 == 0x9234) {
            lVar8 = *plVar7;
            lVar24 = uVar23 * plVar7[2];
            uVar2 = *(undefined8 *)(lVar8 + 4 + lVar24);
            auVar54._4_4_ = (float)(int)uVar2;
            auVar54._0_4_ = (float)*(undefined4 *)(lVar8 + lVar24);
            auVar54._8_4_ = (float)(int)((ulong)uVar2 >> 0x20);
            auVar54._12_4_ = 0.0;
            uVar2 = *(undefined8 *)(lVar8 + 0x10 + lVar24);
            in_XMM2._4_4_ = (int)uVar2;
            in_XMM2._0_4_ = *(undefined4 *)(lVar8 + 0xc + lVar24);
            in_XMM2._8_4_ = (int)((ulong)uVar2 >> 0x20);
            in_XMM2._12_4_ = 0;
            uVar2 = *(undefined8 *)(lVar8 + 0x1c + lVar24);
            in_XMM11._4_4_ = (int)uVar2;
            in_XMM11._0_4_ = *(undefined4 *)(lVar8 + 0x18 + lVar24);
            in_XMM11._8_4_ = (int)((ulong)uVar2 >> 0x20);
            in_XMM11._12_4_ = 0;
            uVar2 = *(undefined8 *)(lVar8 + 0x28 + lVar24);
            in_XMM4._4_4_ = (int)uVar2;
            in_XMM4._0_4_ = *(undefined4 *)(lVar8 + 0x24 + lVar24);
            in_XMM4._8_4_ = (int)((ulong)uVar2 >> 0x20);
            in_XMM4._12_4_ = 0;
          }
          else if (iVar26 == 0xb001) {
            lVar8 = *plVar7;
            lVar24 = uVar23 * plVar7[2];
            auVar71._8_8_ = 0;
            auVar71._0_8_ = *(ulong *)(lVar8 + 0x10 + lVar24);
            auVar71 = insertps(auVar71,*(undefined4 *)(lVar8 + 8 + lVar24),0x20);
            uVar2 = *(undefined8 *)(lVar8 + 0x34 + lVar24);
            auVar48._4_4_ = (int)uVar2;
            auVar48._0_4_ = *(undefined4 *)(lVar8 + lVar24);
            auVar48._8_4_ = (int)((ulong)uVar2 >> 0x20);
            auVar48._12_4_ = 0;
            uVar2 = *(undefined8 *)(lVar8 + 0x1c + lVar24);
            auVar49._4_4_ = (int)uVar2;
            auVar49._0_4_ = *(undefined4 *)(lVar8 + 0x18 + lVar24);
            auVar49._8_4_ = (int)((ulong)uVar2 >> 0x20);
            auVar49._12_4_ = 0;
            fVar27 = *(float *)(lVar8 + 0x24 + lVar24);
            fVar38 = *(float *)(lVar8 + 0x28 + lVar24);
            fVar31 = *(float *)(lVar8 + 0x2c + lVar24);
            fVar41 = *(float *)(lVar8 + 0x30 + lVar24);
            fVar59 = fVar41 * fVar41 + fVar31 * fVar31 + fVar27 * fVar27 + fVar38 * fVar38;
            auVar29 = rsqrtss(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
            fVar43 = auVar29._0_4_;
            auVar40._4_12_ = auVar29._4_12_;
            fVar43 = fVar43 * fVar43 * fVar59 * -0.5 * fVar43 + fVar43 * 1.5;
            in_XMM4 = insertps(auVar49,ZEXT416((uint)(fVar27 * fVar43)),0x30);
            auVar54 = insertps(auVar48,ZEXT416((uint)(fVar38 * fVar43)),0x30);
            auVar40._0_4_ = fVar43 * fVar41;
            auVar29 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar24)),
                               *(undefined4 *)(lVar8 + 4 + lVar24),0x10);
            in_XMM11 = insertps(auVar71,auVar40,0x30);
            auVar29 = insertps(auVar29,*(undefined4 *)(lVar8 + 0x3c + lVar24),0x20);
            in_XMM2 = insertps(auVar29,ZEXT416((uint)(fVar31 * fVar43)),0x30);
          }
          else if (iVar26 == 0x9244) {
            lVar8 = *plVar7;
            lVar24 = uVar23 * plVar7[2];
            auVar54 = *(undefined1 (*) [16])(lVar8 + lVar24);
            in_XMM2 = *(undefined1 (*) [16])(lVar8 + 0x10 + lVar24);
            in_XMM11 = *(undefined1 (*) [16])(lVar8 + 0x20 + lVar24);
            in_XMM4 = *(undefined1 (*) [16])(lVar8 + 0x30 + lVar24);
          }
          fVar59 = in_XMM4._12_4_;
          fVar27 = auVar54._0_4_;
          fVar38 = auVar54._12_4_;
          fVar31 = in_XMM2._4_4_;
          fVar41 = in_XMM2._12_4_;
          fVar55 = in_XMM11._12_4_;
          fVar72 = fVar38 * fVar41 + fVar55 * fVar59;
          fVar58 = fVar38 * fVar41 - fVar55 * fVar59;
          fVar62 = fVar59 * fVar59 + fVar38 * fVar38 + -fVar41 * fVar41 + -fVar55 * fVar55;
          fVar74 = fVar59 * fVar59 - fVar38 * fVar38;
          fVar70 = fVar41 * fVar41 + fVar74 + -fVar55 * fVar55;
          fVar75 = fVar38 * fVar55 - fVar41 * fVar59;
          fVar43 = fVar41 * fVar59 + fVar38 * fVar55;
          fVar73 = fVar41 * fVar55 + fVar38 * fVar59;
          fVar60 = fVar41 * fVar55 - fVar38 * fVar59;
          fVar72 = fVar72 + fVar72;
          fVar75 = fVar75 + fVar75;
          fVar55 = fVar55 * fVar55 + fVar74 + -fVar41 * fVar41;
          fVar63 = fVar62 * 1.0 + fVar72 * 0.0 + fVar75 * 0.0;
          fVar66 = fVar62 * 0.0 + fVar72 * 1.0 + fVar75 * 0.0;
          fVar68 = fVar62 * 0.0 + fVar72 * 0.0 + fVar75 * 1.0;
          fVar75 = fVar62 * 0.0 + fVar72 * 0.0 + fVar75 * 0.0;
          fVar73 = fVar73 + fVar73;
          fVar58 = fVar58 + fVar58;
          fVar62 = fVar58 * 1.0 + fVar70 * 0.0 + fVar73 * 0.0;
          fVar72 = fVar58 * 0.0 + fVar70 * 1.0 + fVar73 * 0.0;
          fVar74 = fVar58 * 0.0 + fVar70 * 0.0 + fVar73 * 1.0;
          fVar58 = fVar58 * 0.0 + fVar70 * 0.0 + fVar73 * 0.0;
          auVar69._0_8_ = auVar54._4_8_;
          auVar69._8_8_ = 0;
          auVar29 = blendps(auVar69,in_XMM2,4);
          fVar43 = fVar43 + fVar43;
          fVar60 = fVar60 + fVar60;
          fVar38 = fVar43 * 1.0 + fVar60 * 0.0 + fVar55 * 0.0;
          fVar41 = fVar43 * 0.0 + fVar60 * 1.0 + fVar55 * 0.0;
          fVar59 = fVar43 * 0.0 + fVar60 * 0.0 + fVar55 * 1.0;
          fVar43 = fVar43 * 0.0 + fVar60 * 0.0 + fVar55 * 0.0;
          local_a8._0_4_ = in_XMM11._0_4_;
          local_a8._4_4_ = in_XMM11._4_4_;
          uStack_a0._0_4_ = in_XMM11._8_4_;
          local_98._0_4_ = in_XMM4._0_4_;
          local_98._4_4_ = in_XMM4._4_4_;
          uStack_90._0_4_ = in_XMM4._8_4_;
          fVar55 = fVar43 * 0.0;
          auVar54._0_4_ = fVar27 * fVar63 + fVar62 * 0.0 + fVar38 * 0.0;
          auVar54._4_4_ = fVar27 * fVar66 + fVar72 * 0.0 + fVar41 * 0.0;
          auVar54._8_4_ = fVar27 * fVar68 + fVar74 * 0.0 + fVar59 * 0.0;
          auVar54._12_4_ = fVar27 * fVar75 + fVar58 * 0.0 + fVar55;
          fVar27 = in_XMM2._0_4_;
          in_XMM8._0_4_ = fVar27 * fVar63 + fVar31 * fVar62 + fVar38 * 0.0;
          in_XMM8._4_4_ = fVar27 * fVar66 + fVar31 * fVar72 + fVar41 * 0.0;
          in_XMM8._8_4_ = fVar27 * fVar68 + fVar31 * fVar74 + fVar59 * 0.0;
          in_XMM8._12_4_ = fVar27 * fVar75 + fVar31 * fVar58 + fVar55;
          in_XMM5._0_4_ =
               (float)local_a8 * fVar63 + local_a8._4_4_ * fVar62 + (float)uStack_a0 * fVar38;
          in_XMM5._4_4_ =
               (float)local_a8 * fVar66 + local_a8._4_4_ * fVar72 + (float)uStack_a0 * fVar41;
          in_XMM5._8_4_ =
               (float)local_a8 * fVar68 + local_a8._4_4_ * fVar74 + (float)uStack_a0 * fVar59;
          in_XMM5._12_4_ =
               (float)local_a8 * fVar75 + local_a8._4_4_ * fVar58 + (float)uStack_a0 * fVar43;
          auVar56._0_4_ =
               (float)local_98 * fVar63 + local_98._4_4_ * fVar62 + (float)uStack_90 * fVar38 +
               auVar29._0_4_ + 0.0;
          auVar56._4_4_ =
               (float)local_98 * fVar66 + local_98._4_4_ * fVar72 + (float)uStack_90 * fVar41 +
               auVar29._4_4_ + 0.0;
          auVar56._8_4_ =
               (float)local_98 * fVar68 + local_98._4_4_ * fVar74 + (float)uStack_90 * fVar59 +
               auVar29._8_4_ + 0.0;
        }
        else if (iVar26 == 0x9134) {
          lVar8 = *plVar7;
          lVar24 = uVar23 * plVar7[2];
          auVar29 = insertps(ZEXT416(*(uint *)(lVar8 + lVar24)),
                             *(undefined4 *)(lVar8 + 0x10 + lVar24),0x1c);
          auVar54 = insertps(auVar29,*(undefined4 *)(lVar8 + 0x20 + lVar24),0x28);
          auVar29 = insertps(ZEXT416(*(uint *)(lVar8 + 4 + lVar24)),
                             *(undefined4 *)(lVar8 + 0x14 + lVar24),0x1c);
          in_XMM8 = insertps(auVar29,*(undefined4 *)(lVar8 + 0x24 + lVar24),0x28);
          auVar29 = insertps(ZEXT416(*(uint *)(lVar8 + 8 + lVar24)),
                             *(undefined4 *)(lVar8 + 0x18 + lVar24),0x1c);
          in_XMM5 = insertps(auVar29,*(undefined4 *)(lVar8 + 0x28 + lVar24),0x28);
          auVar29 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar24)),
                             *(undefined4 *)(lVar8 + 0x1c + lVar24),0x1c);
          auVar29 = insertps(auVar29,*(undefined4 *)(lVar8 + 0x2c + lVar24),0x28);
          auVar56 = auVar29._0_12_;
        }
        else if (iVar26 == 0x9234) {
          lVar8 = *plVar7;
          lVar24 = uVar23 * plVar7[2];
          uVar2 = *(undefined8 *)(lVar8 + 4 + lVar24);
          auVar54._4_4_ = (float)(int)uVar2;
          auVar54._0_4_ = (float)*(undefined4 *)(lVar8 + lVar24);
          auVar54._8_4_ = (float)(int)((ulong)uVar2 >> 0x20);
          auVar54._12_4_ = 0.0;
          uVar2 = *(undefined8 *)(lVar8 + 0x10 + lVar24);
          in_XMM8._4_4_ = (float)(int)uVar2;
          in_XMM8._0_4_ = (float)*(undefined4 *)(lVar8 + 0xc + lVar24);
          in_XMM8._8_4_ = (float)(int)((ulong)uVar2 >> 0x20);
          in_XMM8._12_4_ = 0.0;
          uVar2 = *(undefined8 *)(lVar8 + 0x1c + lVar24);
          in_XMM5._4_4_ = (float)(int)uVar2;
          in_XMM5._0_4_ = (float)*(undefined4 *)(lVar8 + 0x18 + lVar24);
          in_XMM5._8_4_ = (float)(int)((ulong)uVar2 >> 0x20);
          in_XMM5._12_4_ = 0.0;
          uVar2 = *(undefined8 *)(lVar8 + 0x28 + lVar24);
          auVar56._4_4_ = (float)(int)uVar2;
          auVar56._0_4_ = (float)*(undefined4 *)(lVar8 + 0x24 + lVar24);
          auVar56._8_4_ = (float)(int)((ulong)uVar2 >> 0x20);
        }
        else if (iVar26 == 0xb001) {
          lVar8 = *plVar7;
          lVar24 = uVar23 * plVar7[2];
          auVar52._8_8_ = 0;
          auVar52._0_8_ = *(ulong *)(lVar8 + 0x10 + lVar24);
          auVar29 = insertps(auVar52,*(undefined4 *)(lVar8 + 8 + lVar24),0x20);
          uVar2 = *(undefined8 *)(lVar8 + 0x34 + lVar24);
          auVar28._4_4_ = (int)uVar2;
          auVar28._0_4_ = *(undefined4 *)(lVar8 + lVar24);
          auVar28._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar28._12_4_ = 0;
          uVar2 = *(undefined8 *)(lVar8 + 0x1c + lVar24);
          auVar57._4_4_ = (int)uVar2;
          auVar57._0_4_ = *(undefined4 *)(lVar8 + 0x18 + lVar24);
          auVar57._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar57._12_4_ = 0;
          fVar27 = *(float *)(lVar8 + 0x24 + lVar24);
          fVar38 = *(float *)(lVar8 + 0x28 + lVar24);
          fVar31 = *(float *)(lVar8 + 0x2c + lVar24);
          fVar41 = *(float *)(lVar8 + 0x30 + lVar24);
          fVar59 = fVar41 * fVar41 + fVar31 * fVar31 + fVar27 * fVar27 + fVar38 * fVar38;
          auVar54 = rsqrtss(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
          fVar43 = auVar54._0_4_;
          auVar64._4_12_ = auVar54._4_12_;
          fVar43 = fVar43 * fVar43 * fVar59 * -0.5 * fVar43 + fVar43 * 1.5;
          auVar54 = insertps(auVar57,ZEXT416((uint)(fVar27 * fVar43)),0x30);
          auVar56 = auVar54._0_12_;
          auVar54 = insertps(auVar28,ZEXT416((uint)(fVar38 * fVar43)),0x30);
          auVar64._0_4_ = fVar43 * fVar41;
          auVar48 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar24)),
                             *(undefined4 *)(lVar8 + 4 + lVar24),0x10);
          in_XMM5 = insertps(auVar29,auVar64,0x30);
          auVar29 = insertps(auVar48,*(undefined4 *)(lVar8 + 0x3c + lVar24),0x20);
          in_XMM8 = insertps(auVar29,ZEXT416((uint)(fVar31 * fVar43)),0x30);
        }
        else if (iVar26 == 0x9244) {
          lVar8 = *plVar7;
          lVar24 = uVar23 * plVar7[2];
          auVar54 = *(undefined1 (*) [16])(lVar8 + lVar24);
          in_XMM8 = *(undefined1 (*) [16])(lVar8 + 0x10 + lVar24);
          in_XMM5 = *(undefined1 (*) [16])(lVar8 + 0x20 + lVar24);
          auVar56 = SUB1612(*(undefined1 (*) [16])(lVar8 + 0x30 + lVar24),0);
        }
        fVar59 = in_XMM5._0_4_;
        fVar55 = in_XMM5._4_4_;
        fVar58 = in_XMM5._8_4_;
        fVar62 = in_XMM5._12_4_;
        fVar72 = in_XMM8._0_4_;
        fVar74 = in_XMM8._4_4_;
        fVar60 = in_XMM8._8_4_;
        fVar27 = auVar54._0_4_;
        fVar38 = auVar54._4_4_;
        fVar31 = auVar54._8_4_;
        auVar39._0_4_ = fVar72 * fVar55 - fVar74 * fVar59;
        fVar41 = fVar74 * fVar58 - fVar60 * fVar55;
        fVar43 = fVar60 * fVar59 - fVar72 * fVar58;
        auVar33._4_4_ = fVar43;
        auVar33._0_4_ = fVar41;
        auVar33._8_4_ = auVar39._0_4_;
        auVar33._12_4_ = in_XMM8._12_4_ * fVar62 - in_XMM8._12_4_ * fVar62;
        auVar53._0_4_ = fVar59 * fVar38 - fVar55 * fVar27;
        auVar53._4_4_ = fVar55 * fVar31 - fVar58 * fVar38;
        auVar53._8_4_ = fVar58 * fVar27 - fVar59 * fVar31;
        auVar53._12_4_ = fVar62 * auVar54._12_4_ - fVar62 * auVar54._12_4_;
        auVar29 = dpps(auVar54,auVar33,0x7f);
        fVar59 = fVar38 * fVar60 - fVar31 * fVar74;
        auVar54 = insertps(auVar53,auVar53,0x4a);
        auVar39._4_4_ = auVar53._0_4_;
        auVar39._8_4_ = fVar27 * fVar74 - fVar38 * fVar72;
        auVar39._12_4_ = 0;
        auVar47._4_4_ = fVar59;
        auVar47._0_4_ = fVar41;
        auVar47._8_4_ = fVar59;
        auVar47._12_4_ = auVar54._4_4_;
        auVar46._8_8_ = auVar47._8_8_;
        auVar46._4_4_ = auVar54._0_4_;
        auVar46._0_4_ = fVar41;
        auVar34._4_4_ = auVar54._8_4_;
        auVar34._0_4_ = fVar43;
        auVar34._8_4_ = fVar31 * fVar72 - fVar27 * fVar60;
        auVar34._12_4_ = auVar54._12_4_;
        auVar30._0_4_ = auVar29._0_4_;
        auVar30._4_4_ = auVar30._0_4_;
        auVar30._8_4_ = auVar30._0_4_;
        auVar30._12_4_ = auVar30._0_4_;
        auVar48 = divps(auVar46,auVar30);
        auVar29 = divps(auVar34,auVar30);
        auVar54 = divps(auVar39,auVar30);
        fVar27 = auVar56._0_4_;
        fVar38 = auVar56._4_4_;
        fVar31 = auVar56._8_4_;
        fVar37 = auVar54._0_4_;
        fVar42 = auVar54._4_4_;
        fVar44 = auVar54._8_4_;
        fVar32 = auVar29._0_4_;
        fVar35 = auVar29._4_4_;
        fVar36 = auVar29._8_4_;
        fVar45 = auVar48._0_4_;
        fVar50 = auVar48._4_4_;
        fVar51 = auVar48._8_4_;
        fVar61 = fVar27 * fVar45 + fVar38 * fVar32 + fVar31 * fVar37;
        fVar65 = fVar27 * fVar50 + fVar38 * fVar35 + fVar31 * fVar42;
        fVar67 = fVar27 * fVar51 + fVar38 * fVar36 + fVar31 * fVar44;
        fVar27 = *(float *)ray;
        fVar38 = *(float *)(ray + 4);
        uVar2 = *(undefined8 *)ray;
        fVar31 = *(float *)(ray + 8);
        fVar41 = *(float *)(ray + 0xc);
        uVar16 = *(undefined8 *)(ray + 8);
        pRVar1 = ray + 0x10;
        fVar43 = *(float *)pRVar1;
        fVar59 = *(float *)(ray + 0x14);
        fVar55 = *(float *)(ray + 0x18);
        auVar56 = *(undefined1 (*) [12])pRVar1;
        fVar58 = *(float *)(ray + 0x1c);
        auVar29 = *(undefined1 (*) [16])pRVar1;
        pRVar1 = ray + 0x20;
        fVar62 = *(float *)pRVar1;
        fVar72 = *(float *)(ray + 0x24);
        fVar74 = *(float *)(ray + 0x28);
        auVar15 = *(undefined1 (*) [12])pRVar1;
        fVar60 = *(float *)(ray + 0x2c);
        auVar54 = *(undefined1 (*) [16])pRVar1;
        fVar63 = *(float *)(ray + 0x40);
        fVar66 = *(float *)(ray + 0x44);
        uVar17 = *(undefined8 *)(ray + 0x40);
        fVar68 = *(float *)(ray + 0x48);
        fVar75 = *(float *)(ray + 0x4c);
        uVar18 = *(undefined8 *)(ray + 0x48);
        fVar70 = *(float *)(ray + 0x50);
        fVar73 = *(float *)(ray + 0x54);
        uVar19 = *(undefined8 *)(ray + 0x50);
        fVar9 = *(float *)(ray + 0x58);
        fVar10 = *(float *)(ray + 0x5c);
        uVar20 = *(undefined8 *)(ray + 0x58);
        fVar11 = *(float *)(ray + 0x60);
        fVar12 = *(float *)(ray + 100);
        uVar21 = *(undefined8 *)(ray + 0x60);
        fVar13 = *(float *)(ray + 0x68);
        fVar14 = *(float *)(ray + 0x6c);
        uVar22 = *(undefined8 *)(ray + 0x68);
        *(float *)ray = fVar27 * fVar45 + fVar43 * fVar32 + (fVar62 * fVar37 - fVar61);
        *(float *)(ray + 4) = fVar38 * fVar45 + fVar59 * fVar32 + (fVar72 * fVar37 - fVar61);
        *(float *)(ray + 8) = fVar31 * fVar45 + fVar55 * fVar32 + (fVar74 * fVar37 - fVar61);
        *(float *)(ray + 0xc) = fVar41 * fVar45 + fVar58 * fVar32 + (fVar60 * fVar37 - fVar61);
        *(float *)(ray + 0x10) = fVar27 * fVar50 + fVar43 * fVar35 + (fVar62 * fVar42 - fVar65);
        *(float *)(ray + 0x14) = fVar38 * fVar50 + fVar59 * fVar35 + (fVar72 * fVar42 - fVar65);
        *(float *)(ray + 0x18) = fVar31 * fVar50 + fVar55 * fVar35 + (fVar74 * fVar42 - fVar65);
        *(float *)(ray + 0x1c) = fVar41 * fVar50 + fVar58 * fVar35 + (fVar60 * fVar42 - fVar65);
        *(float *)(ray + 0x20) = fVar27 * fVar51 + fVar43 * fVar36 + (fVar62 * fVar44 - fVar67);
        *(float *)(ray + 0x24) = fVar38 * fVar51 + fVar59 * fVar36 + (fVar72 * fVar44 - fVar67);
        *(float *)(ray + 0x28) = fVar31 * fVar51 + fVar55 * fVar36 + (fVar74 * fVar44 - fVar67);
        *(float *)(ray + 0x2c) = fVar41 * fVar51 + fVar58 * fVar36 + (fVar60 * fVar44 - fVar67);
        *(float *)(ray + 0x40) = fVar45 * fVar63 + fVar32 * fVar70 + fVar37 * fVar11;
        *(float *)(ray + 0x44) = fVar45 * fVar66 + fVar32 * fVar73 + fVar37 * fVar12;
        *(float *)(ray + 0x48) = fVar45 * fVar68 + fVar32 * fVar9 + fVar37 * fVar13;
        *(float *)(ray + 0x4c) = fVar45 * fVar75 + fVar32 * fVar10 + fVar37 * fVar14;
        *(float *)(ray + 0x50) = fVar50 * fVar63 + fVar35 * fVar70 + fVar42 * fVar11;
        *(float *)(ray + 0x54) = fVar50 * fVar66 + fVar35 * fVar73 + fVar42 * fVar12;
        *(float *)(ray + 0x58) = fVar50 * fVar68 + fVar35 * fVar9 + fVar42 * fVar13;
        *(float *)(ray + 0x5c) = fVar50 * fVar75 + fVar35 * fVar10 + fVar42 * fVar14;
        *(float *)(ray + 0x60) = fVar51 * fVar63 + fVar36 * fVar70 + fVar44 * fVar11;
        *(float *)(ray + 100) = fVar51 * fVar66 + fVar36 * fVar73 + fVar44 * fVar12;
        *(float *)(ray + 0x68) = fVar51 * fVar68 + fVar36 * fVar9 + fVar44 * fVar13;
        *(float *)(ray + 0x6c) = fVar51 * fVar75 + fVar36 * fVar10 + fVar44 * fVar14;
        local_20 = context->args;
        local_28 = pRVar6;
        (**(code **)(local_30 + 0xa0))(local_48,local_30 + 0x58,ray);
        *(undefined8 *)ray = uVar2;
        *(undefined8 *)(ray + 8) = uVar16;
        local_a8 = auVar56._0_8_;
        uStack_a0 = auVar29._8_8_;
        *(undefined8 *)(ray + 0x10) = local_a8;
        *(undefined8 *)(ray + 0x18) = uStack_a0;
        local_98 = auVar15._0_8_;
        uStack_90 = auVar54._8_8_;
        *(undefined8 *)(ray + 0x20) = local_98;
        *(undefined8 *)(ray + 0x28) = uStack_90;
        *(undefined8 *)(ray + 0x40) = uVar17;
        *(undefined8 *)(ray + 0x48) = uVar18;
        *(undefined8 *)(ray + 0x50) = uVar19;
        *(undefined8 *)(ray + 0x58) = uVar20;
        *(undefined8 *)(ray + 0x60) = uVar21;
        *(undefined8 *)(ray + 0x68) = uVar22;
        fVar27 = *(float *)(ray + 0x84);
        fVar38 = *(float *)(ray + 0x88);
        fVar31 = *(float *)(ray + 0x8c);
        *(uint *)this = -(uint)(*(float *)(ray + 0x80) < 0.0);
        *(uint *)(this + 4) = -(uint)(fVar27 < 0.0);
        *(uint *)(this + 8) = -(uint)(fVar38 < 0.0);
        *(uint *)(this + 0xc) = -(uint)(fVar31 < 0.0);
        pRVar6->instID[0] = 0xffffffff;
        pRVar6->instPrimID[0] = 0xffffffff;
        pGVar25 = extraout_RDX;
      }
      goto LAB_002c8a65;
    }
  }
  *(undefined8 *)this = mm_lookupmask_ps._0_8_;
  *(undefined8 *)(this + 8) = uVar2;
LAB_002c8a65:
  vVar76.field_0._8_8_ = pGVar25;
  vVar76.field_0._0_8_ = this;
  return (vbool<4>)vVar76.field_0;
}

Assistant:

vbool<K> InstanceArrayIntersectorK<K>::occluded(const vbool<K>& valid_i, const Precalculations& pre, RayK<K>& ray, RayQueryContext* context, const Primitive& prim)
    {
      vbool<K> valid = valid_i;
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return false;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      vbool<K> occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3vf<K> world2local = instance->getWorld2Local(prim.primID_);
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);
      }
      return occluded;    
    }